

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

tuple<int,_int> __thiscall Net::login(Net *this,longlong room,string *pass)

{
  int iVar1;
  int iVar2;
  istream *piVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string reply;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  replys;
  string temp;
  string local_1f8;
  string request;
  stringstream stream;
  
  std::__cxx11::to_string(&temp,(longlong)pass);
  std::operator+(&reply,"LOGIN ",&temp);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,&reply
                 ," PASSWORD ");
  std::operator+(&request,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stream,in_RCX);
  std::__cxx11::string::~string((string *)&stream);
  std::__cxx11::string::~string((string *)&reply);
  std::__cxx11::string::~string((string *)&temp);
  reply._M_dataplus._M_p = (pointer)&reply.field_2;
  reply._M_string_length = 0;
  reply.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_1f8,(string *)&request);
  send_with_retry((Net *)room,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (*(int *)room == 0) {
    read_with_retry((Net *)room,&reply);
    if (*(int *)room == 0) {
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&stream,(string *)&reply,_S_out|_S_in);
      temp._M_dataplus._M_p = (pointer)&temp.field_2;
      temp._M_string_length = 0;
      temp.field_2._M_local_buf[0] = '\0';
      replys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      replys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      replys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      while( true ) {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&stream,(string *)&temp,' ');
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        if (temp._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&replys,&temp);
        }
      }
      lVar4 = std::__cxx11::string::find
                        ((char *)replys.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,0x10a71a);
      if (lVar4 == -1) {
        *(undefined4 *)room = 1;
        iVar1 = -1;
        iVar2 = iVar1;
      }
      else {
        iVar1 = std::__cxx11::stoi(replys.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10);
        iVar2 = std::__cxx11::stoi(replys.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,10);
      }
      this->closed = iVar2;
      this->ready = iVar1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&replys);
      std::__cxx11::string::~string((string *)&temp);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      goto LAB_0010825f;
    }
  }
  this->closed = -1;
  this->ready = -1;
LAB_0010825f:
  std::__cxx11::string::~string((string *)&reply);
  std::__cxx11::string::~string((string *)&request);
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int,int> Net::login(long long room,std::string pass){
	std::string request="LOGIN "+std::to_string(room)+" PASSWORD "+pass;
	std::string reply;
	send_with_retry(request);
	if(closed)return std::make_tuple<int,int>(-1,-1);
	read_with_retry(reply);
	if(closed)return std::make_tuple<int,int>(-1,-1);

	std::stringstream stream(reply);
	std::string temp;
	std::vector<std::string> replys;
	while(std::getline(stream,temp,' ')){
		if(!temp.empty()){
			replys.push_back(temp);
		}
	}
	if(replys[0].find("SUCCESS")!=std::string::npos){
		return std::make_tuple<int,int>(std::stoi(replys[1]),std::stoi(replys[2]));
	}
	closed=1;
	return std::make_tuple<int,int>(-1,-1);
}